

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_message.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::objectivec::anon_unknown_7::FieldOrderingByStorageSize::operator()
          (FieldOrderingByStorageSize *this,FieldDescriptor *a,FieldDescriptor *b)

{
  int iVar1;
  int iVar2;
  int order_group_b;
  int order_group_a;
  FieldDescriptor *b_local;
  FieldDescriptor *a_local;
  FieldOrderingByStorageSize *this_local;
  
  iVar1 = OrderGroupForFieldDescriptor(a);
  iVar2 = OrderGroupForFieldDescriptor(b);
  if (iVar1 == iVar2) {
    iVar1 = FieldDescriptor::number(a);
    iVar2 = FieldDescriptor::number(b);
    this_local._7_1_ = iVar1 < iVar2;
  }
  else {
    this_local._7_1_ = iVar1 < iVar2;
  }
  return this_local._7_1_;
}

Assistant:

inline bool operator()(const FieldDescriptor* a,
                         const FieldDescriptor* b) const {
    // Order by grouping.
    const int order_group_a = OrderGroupForFieldDescriptor(a);
    const int order_group_b = OrderGroupForFieldDescriptor(b);
    if (order_group_a != order_group_b) {
      return order_group_a < order_group_b;
    }
    // Within the group, order by field number (provides stable ordering).
    return a->number() < b->number();
  }